

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# import_source.cpp
# Opt level: O1

void __thiscall
ImportSource_hasImportSourceEqualImportSources_Test::
~ImportSource_hasImportSourceEqualImportSources_Test
          (ImportSource_hasImportSourceEqualImportSources_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(ImportSource, hasImportSourceEqualImportSources)
{
    auto importer = libcellml::Importer::create();

    auto importSource1 = libcellml::ImportSource::create();
    importSource1->setUrl("same_url");
    auto importSource2 = libcellml::ImportSource::create();
    importSource2->setUrl("same_url");

    EXPECT_FALSE(importer->hasImportSource(importSource1));
    EXPECT_FALSE(importer->hasImportSource(importSource2));

    importer->addImportSource(importSource1);

    EXPECT_TRUE(importer->hasImportSource(importSource1));
    EXPECT_TRUE(importer->hasImportSource(importSource2));
}